

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_rdlist.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  void *__ptr;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  uint8_t *load_buffer;
  dlog_mt_rdlist_table_t *ptable;
  undefined8 uStack_a8;
  int ret;
  char display_prompt_string2 [21];
  undefined8 local_88;
  char display_prompt_string [21];
  char local_68 [8];
  char phone_number [17];
  uint local_4c;
  FILE *pFStack_48;
  int rdlist_index;
  FILE *ostream;
  FILE *instream;
  char **argv_local;
  int argc_local;
  
  pFStack_48 = (FILE *)0x0;
  ptable._4_4_ = 0;
  if (argc < 2) {
    printf("Usage:\n\tmm_rdlist mm_table_%02x.bin [outputfile.bin]\n",0x37);
    argv_local._4_4_ = -1;
  }
  else {
    pcVar2 = table_to_string('7');
    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar2,0x37);
    __ptr = calloc(1,0x23b);
    if (__ptr == (void *)0x0) {
      printf("Failed to allocate %zu bytes.\n",0x23b);
      argv_local._4_4_ = -0xc;
    }
    else {
      __stream = fopen(argv[1],"rb");
      if (__stream == (FILE *)0x0) {
        printf("Error opening %s\n",argv[1]);
        free(__ptr);
        argv_local._4_4_ = -2;
      }
      else {
        iVar1 = mm_validate_table_fsize('7',(FILE *)__stream,0x23a);
        if (iVar1 == 0) {
          sVar3 = fread((void *)((long)__ptr + 1),0x23a,1,__stream);
          if (sVar3 == 1) {
            fclose(__stream);
            printf(
                  "+-----------------------------------------------------------------------------------------------+\n|  # | Pad            | Number           | Display Prompt       |  Pad2                         |\n+----+----------------+------------------+----------------------+-------------------------------+"
                  );
            for (local_4c = 0; (int)local_4c < 10; local_4c = local_4c + 1) {
              callscrn_num_to_string
                        (local_68,0x11,(uint8_t *)((long)__ptr + (long)(int)local_4c * 0x39 + 4),8);
              if (*(char *)((long)__ptr + (long)(int)local_4c * 0x39 + 0xc) < ' ') {
                snprintf((char *)&local_88,0x15,"%s","                    ");
              }
              else {
                lVar4 = (long)(int)local_4c * 0x39;
                local_88 = *(undefined8 *)((long)__ptr + lVar4 + 0xc);
                display_prompt_string._0_8_ = *(undefined8 *)((long)__ptr + lVar4 + 0x14);
                display_prompt_string._8_4_ = *(undefined4 *)((long)__ptr + lVar4 + 0x1c);
                display_prompt_string[0xc] = '\0';
              }
              if (*(char *)((long)__ptr + (long)(int)local_4c * 0x39 + 0x20) < ' ') {
                snprintf((char *)&stack0xffffffffffffff58,0x15,"%s","                    ");
              }
              else {
                lVar4 = (long)(int)local_4c * 0x39;
                uStack_a8 = *(undefined8 *)((long)__ptr + lVar4 + 0x20);
                display_prompt_string2._0_8_ = *(undefined8 *)((long)__ptr + lVar4 + 0x28);
                display_prompt_string2._8_4_ = *(undefined4 *)((long)__ptr + lVar4 + 0x30);
                display_prompt_string2[0xc] = '\0';
              }
              printf("\n| %2d | 0x%02x,0x%02x,0x%02x | %16s | %s | 0x%02x,0x%02x,0x%02x,0x%02x,0x%02x,0x%02x |"
                     ,(ulong)local_4c,(ulong)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 1)
                     ,(ulong)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 2),
                     (ulong)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 3),local_68,
                     &local_88,(uint)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 0x34),
                     (uint)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 0x35),
                     (uint)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 0x36),
                     (uint)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 0x37),
                     (uint)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 0x38),
                     (uint)*(byte *)((long)__ptr + (long)(int)local_4c * 0x39 + 0x39));
              printf(
                    "\n|    |                |                  | %s |                               |"
                    );
            }
            printf(
                  "\n+-----------------------------------------------------------------------------------------------+\n"
                  );
            memset((void *)((long)__ptr + 4),0,8);
            memcpy((void *)((long)__ptr + 0xc),"***                                     ",0x28);
            string_to_bcd_a("18004880097",(uint8_t *)((long)__ptr + 0x121),'\b');
            memcpy((void *)((long)__ptr + 0x129),"        MCI              0222 TEST      ",0x28);
            string_to_bcd_a("18002882060",(uint8_t *)((long)__ptr + 0x15a),'\b');
            memcpy((void *)((long)__ptr + 0x162),"        AT&T             0288 TEST      ",0x28);
            string_to_bcd_a("18002255288",(uint8_t *)((long)__ptr + 0x193),'\b');
            memcpy((void *)((long)__ptr + 0x19b),"        MCI              0555 TEST      ",0x28);
            string_to_bcd_a("18006261044",(uint8_t *)((long)__ptr + 0x1cc),'\b');
            memcpy((void *)((long)__ptr + 0x1d4),"     0333 TEST         LWM MILLIWATT    ",0x28);
            string_to_bcd_a("12027621401",(uint8_t *)((long)__ptr + 0x205),'\b');
            memcpy((void *)((long)__ptr + 0x20d),"    TIME AND            TEMPERATURE     ",0x28);
            if ((argc < 3) || (pFStack_48 = fopen(argv[2],"wb"), pFStack_48 != (FILE *)0x0)) {
              if (pFStack_48 != (FILE *)0x0) {
                printf("\nWriting new table to %s\n",argv[2]);
                sVar3 = fwrite((void *)((long)__ptr + 1),0x23a,1,pFStack_48);
                if (sVar3 != 1) {
                  printf("Error writing output file %s\n",argv[2]);
                  ptable._4_4_ = -5;
                }
                fclose(pFStack_48);
              }
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              argv_local._4_4_ = ptable._4_4_;
            }
            else {
              printf("Error opening output file %s for write.\n",argv[2]);
              argv_local._4_4_ = -2;
            }
          }
          else {
            pcVar2 = table_to_string('7');
            printf("Error reading %s table.\n",pcVar2);
            free(__ptr);
            fclose(__stream);
            argv_local._4_4_ = -5;
          }
        }
        else {
          free(__ptr);
          fclose(__stream);
          argv_local._4_4_ = -5;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   rdlist_index;
    char  phone_number[17];
    char  display_prompt_string[21];
    char  display_prompt_string2[21];
    int   ret = 0;

    dlog_mt_rdlist_table_t *ptable;
    uint8_t* load_buffer;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_rdlist mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_rdlist_table_t *)calloc(1, sizeof(dlog_mt_rdlist_table_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_rdlist_table_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_rdlist_table_t) - 1) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)ptable) + 1;
    if (fread(load_buffer, sizeof(dlog_mt_rdlist_table_t) - 1, 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+-----------------------------------------------------------------------------------------------+\n" \
           "|  # | Pad            | Number           | Display Prompt       |  Pad2                         |\n" \
           "+----+----------------+------------------+----------------------+-------------------------------+");

    for (rdlist_index = 0; rdlist_index < RDLIST_MAX; rdlist_index++) {
        callscrn_num_to_string(phone_number, sizeof(phone_number), ptable->rd[rdlist_index].phone_number, 8);

        if (ptable->rd[rdlist_index].display_prompt[0] >= 0x20) {
            memcpy(display_prompt_string, ptable->rd[rdlist_index].display_prompt, 20);
            display_prompt_string[20] = '\0';
        } else {
            snprintf(display_prompt_string, sizeof(display_prompt_string), "%s", "                    ");
        }

        if (ptable->rd[rdlist_index].display_prompt[20] >= 0x20) {
            memcpy(display_prompt_string2, &(ptable->rd[rdlist_index].display_prompt[20]), 20);
            display_prompt_string2[20] = '\0';
        } else {
            snprintf(display_prompt_string2, sizeof(display_prompt_string2), "%s", "                    ");
        }

        printf("\n| %2d | 0x%02x,0x%02x,0x%02x | %16s | %s | 0x%02x,0x%02x,0x%02x,0x%02x,0x%02x,0x%02x |",
               rdlist_index,
               ptable->rd[rdlist_index].pad[0],
               ptable->rd[rdlist_index].pad[1],
               ptable->rd[rdlist_index].pad[2],
               phone_number,
               display_prompt_string,
               ptable->rd[rdlist_index].pad2[0],
               ptable->rd[rdlist_index].pad2[1],
               ptable->rd[rdlist_index].pad2[2],
               ptable->rd[rdlist_index].pad2[3],
               ptable->rd[rdlist_index].pad2[4],
               ptable->rd[rdlist_index].pad2[5]);

        printf("\n|    |                |                  | %s |                               |",
               display_prompt_string2);
    }

    printf("\n+-----------------------------------------------------------------------------------------------+\n");

    /* Modify RDLIST table */

    /* Entries 0-4 are the upper five buttons, only accessible on terminals with 10-button Repertory Dialer
     * For five button sets, entry 0 has *** as the display prompt with a zeroed out phone_number.
     */

    /* Button 1 */
    memset(ptable->rd[0].phone_number, 0, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[0].display_prompt, "***                                     ", sizeof(ptable->rd[0].display_prompt));

    /* These are the lower (or only) five buttons. */
    /* Button 6 */
    /*   Number to dial, upto 16 digits */
    string_to_bcd_a("18004880097", ptable->rd[5].phone_number, sizeof(ptable->rd[0].phone_number));
    /*                                   "LINE ONE OF DISPLAY LINE TWO OF DISPLAY " */
    memcpy(ptable->rd[5].display_prompt, "        MCI              0222 TEST      ", sizeof(ptable->rd[0].display_prompt));

    /* Button 7 */
    string_to_bcd_a("18002882060", ptable->rd[6].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[6].display_prompt, "        AT&T             0288 TEST      ", sizeof(ptable->rd[0].display_prompt));

    /* Button 8 */
    string_to_bcd_a("18002255288", ptable->rd[7].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[7].display_prompt, "        MCI              0555 TEST      ", sizeof(ptable->rd[0].display_prompt));

    /* Button 9 */
    string_to_bcd_a("18006261044", ptable->rd[8].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[8].display_prompt, "     0333 TEST         LWM MILLIWATT    ", sizeof(ptable->rd[0].display_prompt));

    /* Button 10 */
    string_to_bcd_a("12027621401", ptable->rd[9].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[9].display_prompt, "    TIME AND            TEMPERATURE     ", sizeof(ptable->rd[0].display_prompt));

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            return -ENOENT;
        }
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(load_buffer, sizeof(dlog_mt_rdlist_table_t) - 1, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (ptable != NULL) {
        free(ptable);
    }

    return ret;
}